

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmBitFieldDn<(moira::Instr)136,(moira::Mode)7,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  char **s;
  u32 uVar1;
  int iVar2;
  Syntax SVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  char *pcVar9;
  char cVar10;
  byte bVar11;
  Dn dn;
  uint uVar12;
  Ea<(moira::Mode)7,_4> result;
  u32 local_44;
  ushort local_40;
  uint local_3c;
  
  uVar1 = *addr;
  *addr = uVar1 + 2;
  uVar5 = (*this->_vptr_Moira[6])();
  if (((short)uVar5 < 0) && ((str->style->syntax & ~MOIRA_MIT) == GNU)) {
    *addr = uVar1;
    dasmIllegal<(moira::Instr)136,(moira::Mode)7,4>(this,str,addr,op);
    return;
  }
  uVar12 = uVar5 & 0xffff;
  local_40 = op & 7;
  uVar4 = uVar12 >> 6;
  uVar6 = uVar4 & 0x1f;
  s = &str->ptr;
  cVar10 = 'b';
  lVar8 = 1;
  do {
    pcVar9 = *s;
    *s = pcVar9 + 1;
    *pcVar9 = cVar10;
    cVar10 = "bfexts"[lVar8];
    lVar8 = lVar8 + 1;
  } while (lVar8 != 7);
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    pcVar9 = *s;
    *s = pcVar9 + 1;
    *pcVar9 = ' ';
  }
  else {
    iVar2 = (str->tab).raw;
    do {
      pcVar9 = str->ptr;
      str->ptr = pcVar9 + 1;
      *pcVar9 = ' ';
    } while (str->ptr < str->base + iVar2);
  }
  local_44 = *addr;
  *addr = local_44 + 2;
  local_3c = (*this->_vptr_Moira[6])(this);
  local_3c = local_3c & 0xffff;
  StrWriter::operator<<(str,(Ea<(moira::Mode)7,_4> *)&local_44);
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    uVar7 = uVar5 & 0x820;
    pcVar9 = *s;
    *s = pcVar9 + 1;
    *pcVar9 = ',';
    if (uVar7 < 0x800) {
      if (uVar7 != 0) {
        sprintd_signed(s,(ulong)uVar6);
LAB_003c8d61:
        pcVar9 = str->ptr;
        str->ptr = pcVar9 + 1;
        *pcVar9 = ',';
        StrWriter::operator<<(str,(Dn)(uVar5 & 7));
        goto LAB_003c8de1;
      }
      sprintd_signed(s,(ulong)uVar6);
      pcVar9 = *s;
      *s = pcVar9 + 1;
    }
    else {
      if (uVar7 != 0x800) {
        StrWriter::operator<<(str,(Dn)(uVar4 & 7));
        goto LAB_003c8d61;
      }
      StrWriter::operator<<(str,(Dn)(uVar4 & 7));
      pcVar9 = str->ptr;
      str->ptr = pcVar9 + 1;
    }
    *pcVar9 = ',';
    sprintd_signed(s,(ulong)(uVar5 & 0x1f));
    goto LAB_003c8de1;
  }
  bVar11 = 0x20;
  if ((uVar5 & 0x1f) != 0) {
    bVar11 = (byte)uVar12 & 0x1f;
  }
  uVar5 = uVar5 & 0x820;
  if (uVar5 < 0x800) {
    if (uVar5 != 0) {
      cVar10 = ' ';
      lVar8 = 0;
      do {
        pcVar9 = *s;
        *s = pcVar9 + 1;
        *pcVar9 = cVar10;
        cVar10 = " {"[lVar8 + 1];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 2);
      sprintd_signed(s,(ulong)uVar6);
LAB_003c8db3:
      pcVar9 = str->ptr;
      str->ptr = pcVar9 + 1;
      *pcVar9 = ':';
      dn.raw._1_3_ = 0;
      dn.raw._0_1_ = bVar11 & 7;
      StrWriter::operator<<(str,dn);
      goto LAB_003c8dd2;
    }
    cVar10 = ' ';
    lVar8 = 0;
    do {
      pcVar9 = *s;
      *s = pcVar9 + 1;
      *pcVar9 = cVar10;
      cVar10 = " {"[lVar8 + 1];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 2);
    sprintd_signed(s,(ulong)uVar6);
    pcVar9 = *s;
    *s = pcVar9 + 1;
    *pcVar9 = ':';
    sprintd_signed(s,(ulong)bVar11);
    pcVar9 = *s;
    *s = pcVar9 + 1;
  }
  else {
    if (uVar5 != 0x800) {
      cVar10 = ' ';
      lVar8 = 0;
      do {
        pcVar9 = *s;
        *s = pcVar9 + 1;
        *pcVar9 = cVar10;
        cVar10 = " {"[lVar8 + 1];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 2);
      StrWriter::operator<<(str,(Dn)(uVar4 & 7));
      goto LAB_003c8db3;
    }
    cVar10 = ' ';
    lVar8 = 0;
    do {
      pcVar9 = *s;
      *s = pcVar9 + 1;
      *pcVar9 = cVar10;
      cVar10 = " {"[lVar8 + 1];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 2);
    StrWriter::operator<<(str,(Dn)(uVar4 & 7));
    pcVar9 = str->ptr;
    str->ptr = pcVar9 + 1;
    *pcVar9 = ':';
    sprintd_signed(s,(ulong)bVar11);
LAB_003c8dd2:
    pcVar9 = str->ptr;
    str->ptr = pcVar9 + 1;
  }
  *pcVar9 = '}';
LAB_003c8de1:
  pcVar9 = str->ptr;
  str->ptr = pcVar9 + 1;
  *pcVar9 = ',';
  SVar3 = str->style->syntax;
  if ((SVar3 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar3 & 0x1f) & 1) != 0)) {
    pcVar9 = *s;
    *s = pcVar9 + 1;
    *pcVar9 = ' ';
  }
  StrWriter::operator<<(str,(Dn)(uVar12 >> 0xc & 7));
  if ((str->style->syntax & ~MOIRA_MIT) != GNU) {
    cVar10 = ';';
    lVar8 = 1;
    do {
      pcVar9 = *s;
      *s = pcVar9 + 1;
      *pcVar9 = cVar10;
      cVar10 = "trap%-2s  ; (2+)"[lVar8 + 10];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 7);
  }
  return;
}

Assistant:

void
Moira::dasmBitFieldDn(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto ext = dasmIncRead <Word>(addr);
    auto dst = _____________xxx(op);
    auto o   = _____xxxxx______(ext);
    auto w   = ___________xxxxx(ext);

    // Catch illegal extension words
    if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

        if (!isValidExt(I, M, op, ext)) {

            addr = old;
            dasmIllegal<I, M, S>(str, addr, op);
            return;
        }
    }

    str << Ins<I>{} << str.tab;

    if constexpr (I == Instr::BFINS) {
        str << Dn ( _xxx____________(ext) ) << Sep{};
    }

    str << Op<M, S>(dst, addr);

    switch (str.style.syntax) {

        case Syntax::GNU:
        case Syntax::GNU_MIT:

            switch (ext & 0x0820) {

                case 0x0000: str << "," << o << "," << w; break;
                case 0x0020: str << "," << o << "," << Dn{w&7}; break;
                case 0x0800: str << "," << Dn{o&7} << "," << w; break;
                case 0x0820: str << "," << Dn{o&7} << "," << Dn{w&7}; break;
            }
            break;

        default:

            if (w == 0) w = 32;

            switch (ext & 0x0820) {

                case 0x0000: str << " {" << o << ":" << w << "}"; break;
                case 0x0020: str << " {" << o << ":" << Dn{w&7} << "}"; break;
                case 0x0800: str << " {" << Dn{o&7} << ":" << w << "}"; break;
                case 0x0820: str << " {" << Dn{o&7} << ":" << Dn{w&7} << "}"; break;
            }
    }

    if constexpr (I == Instr::BFEXTU || I == Instr::BFEXTS || I == Instr::BFFFO) {
        str << Sep{} << Dn ( _xxx____________(ext) );
    }
    str << Av<I, M, S>{};
}